

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O1

Continue __thiscall
cmCoreTryCompile::Arguments::SetSourceType(Arguments *this,string_view sourceType)

{
  int iVar1;
  char *__s1;
  size_t sVar2;
  size_type __rlen;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string local_80;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_60;
  size_t local_48;
  char *local_40;
  undefined8 local_38;
  undefined8 local_30;
  char *local_28;
  undefined8 local_20;
  
  __s1 = sourceType._M_str;
  sVar2 = sourceType._M_len;
  if (sVar2 == 10) {
    iVar1 = bcmp(__s1,"CXX_MODULE",10);
    if (iVar1 == 0) {
      this->SourceTypeContext = CxxModule;
      return Yes;
    }
  }
  else if ((sVar2 == 6) && (iVar1 = bcmp(__s1,"NORMAL",6), iVar1 == 0)) {
    this->SourceTypeContext = Normal;
    return Yes;
  }
  if ((this->SourceTypeError)._M_string_length == 0) {
    local_60.first._M_len = 0x17;
    local_60.first._M_str = "Invalid \'SOURCE_TYPE\' \'";
    local_60.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_38 = 0;
    local_30 = 0x2a;
    local_28 = "\'; must be one of \'SOURCE\' or \'CXX_MODULE\'";
    local_20 = 0;
    views._M_len = 3;
    views._M_array = &local_60;
    local_48 = sVar2;
    local_40 = __s1;
    cmCatViews(&local_80,views);
    std::__cxx11::string::operator=((string *)&this->SourceTypeError,(string *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  return Yes;
}

Assistant:

ArgumentParser::Continue cmCoreTryCompile::Arguments::SetSourceType(
  cm::string_view sourceType)
{
  bool matched = false;
  if (sourceType == "NORMAL"_s) {
    this->SourceTypeContext = SourceType::Normal;
    matched = true;
  } else if (sourceType == "CXX_MODULE"_s) {
    this->SourceTypeContext = SourceType::CxxModule;
    matched = true;
  }

  if (!matched && this->SourceTypeError.empty()) {
    // Only remember one error at a time; all other errors related to argument
    // parsing are "indicate one error and return" anyways.
    this->SourceTypeError =
      cmStrCat("Invalid 'SOURCE_TYPE' '", sourceType,
               "'; must be one of 'SOURCE' or 'CXX_MODULE'");
  }
  return ArgumentParser::Continue::Yes;
}